

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
delta_complex_cell_t::compute_boundary
          (delta_complex_cell_t *this,delta_complex_t *complex,size_t thread,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  pointer pvVar1;
  long lVar2;
  pointer pvVar3;
  vector<long,_std::allocator<long>_> *__first1;
  vector<long,_std::allocator<long>_> *__last1;
  iterator iVar4;
  iterator __position;
  delta_complex_t *this_00;
  bool bVar5;
  pointer plVar6;
  pointer pvVar7;
  index_t iVar8;
  ulong uVar9;
  long lVar10;
  pointer plVar11;
  long *__args;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *this_01;
  ulong uVar12;
  ulong uVar13;
  vector<long,_std::allocator<long>_> temp;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  tempOrient;
  vector<long,_std::allocator<long>_> local_128;
  vector<long,_std::allocator<long>_> local_108;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_e8;
  vector<long,std::allocator<long>> *local_d0;
  size_t local_c8;
  vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
  *local_c0;
  delta_complex_t *local_b8;
  ulong local_b0;
  vector<long,_std::allocator<long>_> local_a8;
  vector<long,_std::allocator<long>_> local_90;
  vector<long,_std::allocator<long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar11 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (plVar11 != plVar6) {
    local_d0 = (vector<long,std::allocator<long>> *)&this->boundary;
    uVar13 = 0;
    local_c8 = thread;
    local_c0 = new_cell_cofaces;
    local_b8 = complex;
    do {
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (plVar11 != plVar6) {
        local_b0 = 1;
        if (1 < (uint)uVar13) {
          local_b0 = uVar13 & 0xffffffff;
        }
        uVar12 = 0;
        do {
          if (uVar12 != uVar13) {
            if (local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_128,
                         (iterator)
                         local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,plVar6 + uVar12);
            }
            else {
              *local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = plVar6[uVar12];
              local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (uVar12 == 0 || uVar13 <= uVar12) {
              if (local_b0 < uVar12) {
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                ::emplace_back<std::vector<long,std::allocator<long>>>
                          ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                            *)&local_e8,&local_108);
                if (local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_108.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_108.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                pvVar7 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                plVar6 = pvVar7[uVar12 - 1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (*(pointer *)
                     ((long)&pvVar7[uVar12 - 1].super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data + 8) != plVar6) {
                  lVar10 = 0;
                  uVar9 = 0;
                  do {
                    if (uVar13 != uVar9) {
                      iVar4._M_current =
                           local_e8.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar4._M_current ==
                          local_e8.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                                  ((vector<long,std::allocator<long>> *)
                                   (local_e8.
                                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1),iVar4,
                                   (long *)((long)plVar6 + lVar10));
                        pvVar7 = (this->orientation).
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        *iVar4._M_current = *(long *)((long)plVar6 + lVar10);
                        local_e8.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                      }
                    }
                    uVar9 = uVar9 + 1;
                    plVar6 = pvVar7[uVar12 - 1].super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    lVar10 = lVar10 + 8;
                  } while (uVar9 < (ulong)((long)*(pointer *)
                                                  ((long)&pvVar7[uVar12 - 1].
                                                                                                                    
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                           (long)plVar6 >> 3));
                }
              }
            }
            else {
              std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::push_back(&local_e8,
                          (this->orientation).
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (uVar12 - 1));
            }
          }
          uVar12 = uVar12 + 1;
          plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(this->vertices).
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)plVar6 >> 3));
      }
      this_00 = local_b8;
      uVar12 = 0;
      while( true ) {
        plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        plVar11 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar1 = (this_00->cliques).
                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector(&local_60,&local_128);
        iVar8 = delta_complex_t::get_clique(this_00,&local_60);
        lVar10 = *(long *)&pvVar1[((ulong)((long)plVar6 - (long)plVar11) >> 3) - 2].
                           super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                           super__Vector_impl_data;
        lVar2 = *(long *)(lVar10 + 8 + iVar8 * 0x70);
        lVar10 = *(long *)(lVar10 + iVar8 * 0x70);
        if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((ulong)(lVar2 - lVar10 >> 3) <= uVar12) goto LAB_001123ff;
        uVar9 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3;
        pvVar3 = (this_00->cells).
                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = (this_00->cliques).
                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector(&local_78,&local_128);
        iVar8 = delta_complex_t::get_clique(this_00,&local_78);
        lVar10 = *(long *)(*(long *)(*(long *)&pvVar1[uVar9 - 2].
                                               super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                               ._M_impl + iVar8 * 0x70) + uVar12 * 8);
        lVar2 = *(long *)&pvVar3[uVar9 - 2].
                          super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
        ;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector(&local_48,&local_e8);
        lVar10 = lVar10 * 0xe8;
        __first1 = *(vector<long,_std::allocator<long>_> **)(lVar2 + 0x48 + lVar10);
        __last1 = *(vector<long,_std::allocator<long>_> **)(lVar2 + 0x50 + lVar10);
        if ((long)__last1 - (long)__first1 ==
            (long)local_48.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          bVar5 = std::__equal<false>::
                  equal<std::vector<long,std::allocator<long>>const*,std::vector<long,std::allocator<long>>const*>
                            (__first1,__last1,
                             local_48.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          bVar5 = false;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&local_48);
        if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (bVar5 != false) break;
        uVar12 = uVar12 + 1;
      }
      uVar9 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      pvVar3 = (this_00->cells).
               super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (this_00->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::vector(&local_90,&local_128);
      iVar8 = delta_complex_t::get_clique(this_00,&local_90);
      __args = (long *)(*(long *)&pvVar3[uVar9 - 2].
                                  super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        + *(long *)(*(long *)(*(long *)&pvVar1[uVar9 - 2].
                                                                                                                
                                                  super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                                  ._M_impl + iVar8 * 0x70) + uVar12 * 8) * 0xe8 +
                       0x60);
      iVar4._M_current =
           (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (local_d0,iVar4,__args);
      }
      else {
        *iVar4._M_current = *__args;
        (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      this_01 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                ((local_c0->
                 super__Vector_base<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_c8);
      plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      plVar11 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar1 = (this_00->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::vector(&local_a8,&local_128);
      iVar8 = delta_complex_t::get_clique(this_00,&local_a8);
      local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)
                  (*(long *)(*(long *)&pvVar1[((ulong)((long)plVar6 - (long)plVar11) >> 3) - 2].
                                       super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                                       _M_impl.super__Vector_impl_data + iVar8 * 0x70) + uVar12 * 8)
      ;
      local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)this->location;
      __position._M_current = *(pair<long,_long> **)(this_01 + 8);
      if (__position._M_current == *(pair<long,_long> **)(this_01 + 0x10)) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>(this_01,__position,(pair<long,_long> *)&local_108);
      }
      else {
        (__position._M_current)->first =
             (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        (__position._M_current)->second =
             (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x10;
      }
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
LAB_001123ff:
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_e8);
      if (local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
      plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar11 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar13 < (ulong)((long)plVar11 - (long)plVar6 >> 3));
  }
  return;
}

Assistant:

void delta_complex_cell_t::compute_boundary(delta_complex_t* complex, size_t thread, std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
	//For each vertex delete it from the face, by removing it from the vertex set and
	//the relevant rows and columns of the orientation matrix
	//find this face in the complex and add its index to the boundary of the cell,
	//also add this cell to the coboundary of the found cell
	for(int i = 0; i < vertices.size(); i++){
		std::vector<index_t> temp;
		std::vector<std::vector<index_t>> tempOrient;
		for(int j = 0; j < vertices.size(); j++){
			if(j != i){
				temp.push_back(vertices[j]);
				if(j < i && j > 0){ tempOrient.push_back(orientation[j-1]);
				} else if(j > i && j > 1){
					tempOrient.push_back(std::vector<index_t>());
					for(int k = 0; k < orientation[j-1].size(); k++){
						if(k != i){
							tempOrient.back().push_back(orientation[j-1][k]);
						}
					}
				}
			}
		}
        bool found = false;
        int f = 0;
        while(!found && f < complex->cliques[dimension()-1][complex->get_clique(temp)].faces.size()){
			if(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].same_orientation(tempOrient)){
				boundary.push_back(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].location);
                new_cell_cofaces[thread].push_back(std::make_pair(complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f],location));
				found = true;
			}
            f++;
		}
	}
}